

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_signature.hpp
# Opt level: O0

void chaiscript::dispatch::detail::
     function_signature<chaiscript::Boxed_Number_const(*)(chaiscript::Boxed_Number_const&)>
               (_func_Boxed_Number_Boxed_Number_ptr **f)

{
  _func_Boxed_Number_Boxed_Number_ptr **f_local;
  
  Function_Signature<chaiscript::Boxed_Number_const,chaiscript::dispatch::detail::Function_Params<chaiscript::Boxed_Number_const&>,false,false,false,false>
  ::Function_Signature<chaiscript::Boxed_Number_const(*const&)(chaiscript::Boxed_Number_const&)>
            ((Function_Signature<chaiscript::Boxed_Number_const,chaiscript::dispatch::detail::Function_Params<chaiscript::Boxed_Number_const&>,false,false,false,false>
              *)((long)&f_local + 7),f);
  return;
}

Assistant:

auto function_signature(const Func &f) {
    if constexpr (has_call_operator<Func>::value) {
      return Function_Signature<typename decltype(Function_Signature{&std::decay_t<Func>::operator()})::Return_Type,
                                typename decltype(Function_Signature{&std::decay_t<Func>::operator()})::Param_Types,
                                decltype(Function_Signature{&std::decay_t<Func>::operator()})::is_noexcept,
                                false,
                                false,
                                true>{};
    } else {
      return Function_Signature{f};
    }
  }